

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O0

void __thiscall kj::_::ForkBranchBase::~ForkBranchBase(ForkBranchBase *this)

{
  ForkBranchBase **ppFVar1;
  ForkHubBase *pFVar2;
  ForkBranchBase ***local_40;
  ForkBranchBase *this_local;
  
  (this->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_005d27a8;
  if (this->prevPtr != (ForkBranchBase **)0x0) {
    *this->prevPtr = this->next;
    ppFVar1 = this->prevPtr;
    if (this->next == (ForkBranchBase *)0x0) {
      pFVar2 = Own<kj::_::ForkHubBase>::operator->(&this->hub);
      local_40 = &pFVar2->tailBranch;
    }
    else {
      local_40 = &this->next->prevPtr;
    }
    *local_40 = ppFVar1;
  }
  Own<kj::_::ForkHubBase>::~Own(&this->hub);
  return;
}

Assistant:

ForkBranchBase::~ForkBranchBase() noexcept(false) {
  if (prevPtr != nullptr) {
    // Remove from hub's linked list of branches.
    *prevPtr = next;
    (next == nullptr ? hub->tailBranch : next->prevPtr) = prevPtr;
  }
}